

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_external_fixups.hpp
# Opt level: O0

void compare_external_fixups<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
               (database *export_db,
               vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               *exported_fixups,database *import_db,
               vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               *imported_fixups)

{
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  pointer peVar4;
  pointer peVar5;
  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>
  *matcher;
  raw_sstring_view rVar6;
  AssertHelper local_178;
  Message local_170;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>
  local_168;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>_>
  local_150;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_120;
  Message local_118;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_110;
  string_address local_108;
  raw_sstring_view local_100;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_f0;
  string_address local_e8;
  raw_sstring_view local_e0;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_1;
  shared_sstring_view export_owner;
  shared_sstring_view import_owner;
  size_t count;
  iterator export_end;
  iterator export_it;
  iterator import_it;
  anon_class_1_0_00000001 load_string;
  Message local_50;
  size_type local_48;
  size_type local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
  *imported_fixups_local;
  database *import_db_local;
  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
  *exported_fixups_local;
  database *export_db_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )imported_fixups;
  local_40 = std::
             vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::
             size(exported_fixups);
  local_48 = std::
             vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::
             size((vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                   *)gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_38,"exported_fixups.size ()","imported_fixups.size ()",&local_40,
             &local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pMVar2 = testing::Message::operator<<
                       (&local_50,
                        (char (*) [76])
                        "Expected the number of xfixups imported to match the number we started with"
                       );
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/compare_external_fixups.hpp"
               ,0x21,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff98,pMVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff98);
    testing::Message::~Message(&local_50);
  }
  import_it._M_current._5_3_ = 0;
  import_it._M_current._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (import_it._M_current._4_4_ == 0) {
    export_it = std::
                begin<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
                          ((vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                            *)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    export_end = std::
                 begin<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
                           (exported_fixups);
    count = (size_t)std::
                    end<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
                              (exported_fixups);
    import_owner.size_ = 0;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&export_end,
                         (__normal_iterator<pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
                          *)&count);
      if (!bVar1) break;
      pstore::sstring_view<std::shared_ptr<const_char>_>::sstring_view
                ((sstring_view<std::shared_ptr<const_char>_> *)&export_owner.size_);
      pstore::sstring_view<std::shared_ptr<const_char>_>::sstring_view
                ((sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar_1.message_);
      peVar4 = __gnu_cxx::
               __normal_iterator<pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
               ::operator->(&export_it);
      local_e8.a_.a_ = (address)(peVar4->name).a_.a_;
      pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::not_null
                (&local_f0,(sstring_view<std::shared_ptr<const_char>_> *)&export_owner.size_);
      rVar6 = compare_external_fixups<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
              ::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&import_it._M_current + 3),import_db,
                         local_e8,local_f0);
      local_e0 = rVar6;
      peVar4 = __gnu_cxx::
               __normal_iterator<pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
               ::operator->(&export_end);
      local_108.a_.a_ = (address)(peVar4->name).a_.a_;
      pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::not_null
                (&local_110,(sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar_1.message_);
      rVar6 = compare_external_fixups<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
              ::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&import_it._M_current + 3),export_db,
                         local_108,local_110);
      local_100 = rVar6;
      testing::internal::EqHelper::
      Compare<pstore::sstring_view<const_char_*>,_pstore::sstring_view<const_char_*>,_nullptr>
                ((EqHelper *)local_d0,"load_string (import_db, import_it->name, &import_owner)",
                 "load_string (export_db, export_it->name, &export_owner)",&local_e0,&local_100);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_118);
        pMVar2 = testing::Message::operator<<(&local_118,(char (*) [17])"Names of fixup #");
        pMVar2 = testing::Message::operator<<(pMVar2,&import_owner.size_);
        pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [17])". exported name:");
        peVar4 = __gnu_cxx::
                 __normal_iterator<pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
                 ::operator->(&export_end);
        pMVar2 = testing::Message::operator<<(pMVar2,&peVar4->name);
        pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [17])", imported name:");
        peVar4 = __gnu_cxx::
                 __normal_iterator<pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
                 ::operator->(&export_it);
        pMVar2 = testing::Message::operator<<(pMVar2,&peVar4->name);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_120,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/compare_external_fixups.hpp"
                   ,0x3a,pcVar3);
        testing::internal::AssertHelper::operator=(&local_120,pMVar2);
        testing::internal::AssertHelper::~AssertHelper(&local_120);
        testing::Message::~Message(&local_118);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      memset(&gtest_ar_2.message_,0,8);
      pstore::typed_address<pstore::indirect_string>::typed_address
                ((typed_address<pstore::indirect_string> *)&gtest_ar_2.message_);
      peVar4 = __gnu_cxx::
               __normal_iterator<pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
               ::operator->(&export_it);
      (peVar4->name).a_.a_ =
           (value_type)
           gtest_ar_2.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      peVar5 = __gnu_cxx::
               __normal_iterator<pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
               ::operator->(&export_end);
      (peVar5->name).a_.a_ = (peVar4->name).a_.a_;
      pstore::sstring_view<std::shared_ptr<const_char>_>::~sstring_view
                ((sstring_view<std::shared_ptr<const_char>_> *)&gtest_ar_1.message_);
      pstore::sstring_view<std::shared_ptr<const_char>_>::~sstring_view
                ((sstring_view<std::shared_ptr<const_char>_> *)&export_owner.size_);
      __gnu_cxx::
      __normal_iterator<pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
      ::operator++(&export_it);
      __gnu_cxx::
      __normal_iterator<pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
      ::operator++(&export_end);
      import_owner.size_ = import_owner.size_ + 1;
    }
    testing::
    ContainerEq<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
              (&local_168,(testing *)exported_fixups,rhs);
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
              (&local_150,(internal *)&local_168,matcher);
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
    ::operator()(local_138,(char *)&local_150,
                 (vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                  *)"imported_fixups");
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>_>
    ::~PredicateFormatterFromMatcher(&local_150);
    testing::
    PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>
    ::~PolymorphicMatcher(&local_168);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
    if (!bVar1) {
      testing::Message::Message(&local_170);
      pMVar2 = testing::Message::operator<<
                         (&local_170,(char (*) [47])"The imported and exported xfixups should match"
                         );
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
      testing::internal::AssertHelper::AssertHelper
                (&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/compare_external_fixups.hpp"
                 ,0x45,pcVar3);
      testing::internal::AssertHelper::operator=(&local_178,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(&local_178);
      testing::Message::~Message(&local_170);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  }
  return;
}

Assistant:

void compare_external_fixups (pstore::database const & export_db,
                              ExportsContainer & exported_fixups,
                              pstore::database const & import_db,
                              ImportsContainer & imported_fixups) {

    ASSERT_EQ (exported_fixups.size (), imported_fixups.size ())
        << "Expected the number of xfixups imported to match the number we started with";

    using string_address = pstore::typed_address<pstore::indirect_string>;

    auto const load_string = [] (pstore::database const & db, string_address const addr,
                                 pstore::gsl::not_null<pstore::shared_sstring_view *> const owner) {
        return pstore::indirect_string::read (db, addr).as_string_view (owner);
    };

    // The name fields are tricky here. The imported and exported fixups are from different
    // databases so we can't simply compare string addresses to find out if they point to the
    // same string. Instead we must load each of the strings and compare them directly.
    // However, we still want to use operator== for all of the other fields so that we don't
    // end up having to duplicate the rest of the comparison method here. Setting both name
    // fields to 0 after comparison allows us to do that.
    {
        auto import_it = std::begin (imported_fixups);
        auto export_it = std::begin (exported_fixups);
        auto const export_end = std::end (exported_fixups);
        auto count = std::size_t{0};
        for (; export_it != export_end; ++import_it, ++export_it, ++count) {
            pstore::shared_sstring_view import_owner;
            pstore::shared_sstring_view export_owner;
            EXPECT_EQ (load_string (import_db, import_it->name, &import_owner),
                       load_string (export_db, export_it->name, &export_owner))
                << "Names of fixup #" << count << ". exported name:" << export_it->name
                << ", imported name:" << import_it->name;

            // Set the import and export name values to the same address (it doesn't matter what
            // that address is). This will mean that differences won't cause failures as we
            // compare the two containers.
            export_it->name = import_it->name = string_address ();
        }
    }

    EXPECT_THAT (imported_fixups, testing::ContainerEq (exported_fixups))
        << "The imported and exported xfixups should match";
}